

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::GetShortPathToFile_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this,char *cfname)

{
  string *psVar1;
  cmSystemTools *pcVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char *in_RCX;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1a9;
  string *local_1a8;
  string *res;
  undefined1 local_198 [6];
  bool inBld;
  bool inSrc;
  string bldRelpath;
  string srcRelpath;
  string local_150;
  undefined1 local_130 [8];
  string fname;
  string local_108;
  string local_e8;
  string local_c8;
  string *local_a8;
  string *buildDir;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  string *local_28;
  string *sourceDir;
  char *cfname_local;
  cmCTest *this_local;
  string *path;
  
  sourceDir = (string *)cfname;
  cfname_local = (char *)this;
  this_local = (cmCTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"SourceDirectory",&local_89);
  GetCTestConfiguration(&local_68,this,&local_88);
  cmsys::SystemTools::CollapseFullPath(&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_28 = &local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_108,"BuildDirectory",(allocator *)(fname.field_2._M_local_buf + 0xf));
  GetCTestConfiguration(&local_e8,this,&local_108);
  cmsys::SystemTools::CollapseFullPath(&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
  psVar1 = sourceDir;
  local_a8 = &local_c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,(char *)psVar1,
             (allocator *)(srcRelpath.field_2._M_local_buf + 0xf));
  cmsys::SystemTools::CollapseFullPath((string *)local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)(srcRelpath.field_2._M_local_buf + 0xf));
  pcVar2 = (cmSystemTools *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::RelativePath_abi_cxx11_
            ((string *)((long)&bldRelpath.field_2 + 8),pcVar2,pcVar3,in_RCX);
  pcVar2 = (cmSystemTools *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::RelativePath_abi_cxx11_((string *)local_198,pcVar2,pcVar3,in_RCX);
  lVar4 = std::__cxx11::string::find(bldRelpath.field_2._M_local_buf + 8,0xbcac2f);
  res._7_1_ = lVar4 == -1;
  lVar4 = std::__cxx11::string::find(local_198,0xbcac2f);
  res._6_1_ = lVar4 == -1;
  local_1a8 = (string *)0x0;
  if (((res._7_1_ & 1) == 0) || (!(bool)res._6_1_)) {
    if ((res._7_1_ & 1) == 0) {
      if ((bool)res._6_1_) {
        local_1a8 = (string *)local_198;
      }
    }
    else {
      local_1a8 = (string *)((long)&bldRelpath.field_2 + 8);
    }
  }
  else {
    uVar5 = std::__cxx11::string::size();
    uVar6 = std::__cxx11::string::size();
    if (uVar5 < uVar6) {
      local_1a8 = (string *)((long)&bldRelpath.field_2 + 8);
    }
    else {
      local_1a8 = (string *)local_198;
    }
  }
  local_1a9 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_1a8 == (string *)0x0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_130);
  }
  else {
    cmsys::SystemTools::ConvertToUnixSlashes(local_1a8);
    std::operator+(&local_1d0,"./",local_1a8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::size();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar3 == '/') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_1f0,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1f0);
      std::__cxx11::string::~string(local_1f0);
    }
  }
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","_");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","_");
  local_1a9 = 1;
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)(bldRelpath.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetShortPathToFile(const char* cfname)
{
  const std::string& sourceDir = cmSystemTools::CollapseFullPath(
    this->GetCTestConfiguration("SourceDirectory"));
  const std::string& buildDir = cmSystemTools::CollapseFullPath(
    this->GetCTestConfiguration("BuildDirectory"));
  std::string fname = cmSystemTools::CollapseFullPath(cfname);

  // Find relative paths to both directories
  std::string srcRelpath =
    cmSystemTools::RelativePath(sourceDir.c_str(), fname.c_str());
  std::string bldRelpath =
    cmSystemTools::RelativePath(buildDir.c_str(), fname.c_str());

  // If any contains "." it is not parent directory
  bool inSrc = srcRelpath.find("..") == std::string::npos;
  bool inBld = bldRelpath.find("..") == std::string::npos;
  // TODO: Handle files with .. in their name

  std::string* res = CM_NULLPTR;

  if (inSrc && inBld) {
    // If both have relative path with no dots, pick the shorter one
    if (srcRelpath.size() < bldRelpath.size()) {
      res = &srcRelpath;
    } else {
      res = &bldRelpath;
    }
  } else if (inSrc) {
    res = &srcRelpath;
  } else if (inBld) {
    res = &bldRelpath;
  }

  std::string path;

  if (!res) {
    path = fname;
  } else {
    cmSystemTools::ConvertToUnixSlashes(*res);

    path = "./" + *res;
    if (path[path.size() - 1] == '/') {
      path = path.substr(0, path.size() - 1);
    }
  }

  cmsys::SystemTools::ReplaceString(path, ":", "_");
  cmsys::SystemTools::ReplaceString(path, " ", "_");
  return path;
}